

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O2

ResponseLine * __thiscall
SelectGenericCommand::trigger(SelectGenericCommand *this,string_view parameters)

{
  long lVar1;
  ResponseLine *pRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string_view parameters_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar1 = IRCCommand::selected_server;
  parameters_local._M_str = parameters._M_str;
  parameters_local._M_len = parameters._M_len;
  if (parameters_local._M_len == 0) {
    pRVar2 = (ResponseLine *)operator_new(0x30);
    if (lVar1 == 0) {
      Jupiter::GenericCommand::ResponseLine::ResponseLine
                (pRVar2,0x24,"No IRC server is currently selected.",0);
      return pRVar2;
    }
    local_48 = (basic_string_view<char,_std::char_traits<char>_>)
               Jupiter::IRC::Client::getConfigSection();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_b8,&local_48,&local_d9);
    s_abi_cxx11_(&local_d8," is currently selected.",0x17);
    std::operator+(&local_38,&local_b8,&local_d8);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,&local_38,0);
    pbVar3 = &local_38;
  }
  else {
    if (IRCCommand::active_server == IRCCommand::selected_server) {
      IRCCommand::active_server = 0;
    }
    IRCCommand::selected_server = ServerManager::getServer(_serverManager);
    if (IRCCommand::selected_server == 0) {
      pRVar2 = (ResponseLine *)operator_new(0x30);
      local_b8._M_dataplus._M_p = (pointer)0x13;
      local_b8._M_string_length = 0x11000a;
      local_d8._M_dataplus._M_p = (pointer)0x31;
      local_d8._M_string_length = 0x11001e;
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
                (&local_68,(jessilib *)&local_b8,&parameters_local,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_d8,in_R8);
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,&local_68,2);
      pbVar3 = &local_68;
      goto LAB_0010cdbd;
    }
    if (IRCCommand::active_server == 0) {
      IRCCommand::active_server = IRCCommand::selected_server;
    }
    pRVar2 = (ResponseLine *)operator_new(0x30);
    local_48 = (basic_string_view<char,_std::char_traits<char>_>)
               Jupiter::IRC::Client::getConfigSection();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_b8,&local_48,&local_d9);
    s_abi_cxx11_(&local_d8," is now selected.",0x11);
    std::operator+(&local_88,&local_b8,&local_d8);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,&local_88,0);
    pbVar3 = &local_88;
  }
  std::__cxx11::string::~string((string *)pbVar3);
  std::__cxx11::string::~string((string *)&local_d8);
  pbVar3 = &local_b8;
LAB_0010cdbd:
  std::__cxx11::string::~string((string *)pbVar3);
  return pRVar2;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *SelectGenericCommand::trigger(std::string_view parameters)
{
	if (parameters.empty())
	{
		if (IRCCommand::selected_server == nullptr)
			return new Jupiter::GenericCommand::ResponseLine("No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicSuccess);
		return new Jupiter::GenericCommand::ResponseLine(std::string{IRCCommand::selected_server->getConfigSection()} + " is currently selected."s, GenericCommand::DisplayType::PublicSuccess);
	}
	if (IRCCommand::active_server == IRCCommand::selected_server)
		IRCCommand::active_server = nullptr;

	IRCCommand::selected_server = serverManager->getServer(parameters);
	if (IRCCommand::selected_server == nullptr)
		return new Jupiter::GenericCommand::ResponseLine(jessilib::join<std::string>("Error: IRC server \""sv, parameters, "\" not found. No IRC server is currently selected."sv), GenericCommand::DisplayType::PublicError);

	if (IRCCommand::active_server == nullptr)
		IRCCommand::active_server = IRCCommand::selected_server;
	return new Jupiter::GenericCommand::ResponseLine(std::string{IRCCommand::selected_server->getConfigSection()} + " is now selected."s, GenericCommand::DisplayType::PublicSuccess);
}